

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testCenter<Imath_3_2::Vec3<int>>(char *type)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  int *piVar6;
  char *in_RDI;
  Box<Imath_3_2::Vec3<int>_> b_1;
  Vec3<int> max;
  Vec3<int> min;
  Box<Imath_3_2::Vec3<int>_> b1;
  int hi;
  int lo;
  uint i;
  Vec3<int> p1;
  Vec3<int> p0;
  Box<Imath_3_2::Vec3<int>_> b0;
  Box<Imath_3_2::Vec3<int>_> b;
  int in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  Vec3<int> *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  Box<Imath_3_2::Vec3<int>_> *in_stack_fffffffffffffee8;
  Vec3<int> local_f8;
  Vec3<int> local_ec [2];
  Vec3<int> local_d4;
  Vec3<int> local_c8 [3];
  int local_a4;
  int local_a0;
  uint local_9c;
  Vec3<int> local_98;
  Vec3<int> local_8c;
  Vec3<int> local_80;
  Vec3<int> local_74;
  Vec3<int> local_68;
  Vec3<int> local_5c [3];
  Vec3<int> local_38;
  Vec3<int> local_2c [3];
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    center() for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::Box
            ((Box<Imath_3_2::Vec3<int>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::center(in_stack_fffffffffffffee8);
  Imath_3_2::Vec3<int>::Vec3(&local_38,0);
  bVar2 = Imath_3_2::Vec3<int>::operator==(local_2c,&local_38);
  if (!bVar2) {
    __assert_fail("b.center () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x2a2,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_3_2::Vec3<int>]")
    ;
  }
  Imath_3_2::Vec3<int>::Vec3(local_5c,-1);
  Imath_3_2::Vec3<int>::Vec3(&local_68,1);
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::Box
            ((Box<Imath_3_2::Vec3<int>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
             ,(Vec3<int> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::center(in_stack_fffffffffffffee8);
  Imath_3_2::Vec3<int>::Vec3(&local_80,0);
  bVar2 = Imath_3_2::Vec3<int>::operator==(&local_74,&local_80);
  if (!bVar2) {
    __assert_fail("b0.center () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x2b4,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_3_2::Vec3<int>]")
    ;
  }
  Imath_3_2::Vec3<int>::Vec3(&local_8c);
  Imath_3_2::Vec3<int>::Vec3(&local_98);
  local_9c = 0;
  while( true ) {
    uVar4 = local_9c;
    uVar3 = Imath_3_2::Vec3<int>::dimensions();
    if (uVar3 <= uVar4) break;
    local_a0 = 1 << ((char)local_9c + 1U & 0x1f);
    uVar4 = Imath_3_2::Vec3<int>::dimensions();
    local_a4 = 1 << ((char)uVar4 - (char)local_9c & 0x1fU);
    iVar1 = -local_a0;
    piVar6 = Imath_3_2::Vec3<int>::operator[](&local_8c,local_9c);
    *piVar6 = iVar1;
    in_stack_fffffffffffffed0 = local_a4;
    piVar6 = Imath_3_2::Vec3<int>::operator[](&local_98,local_9c);
    *piVar6 = in_stack_fffffffffffffed0;
    local_9c = local_9c + 1;
  }
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::Box
            ((Box<Imath_3_2::Vec3<int>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
             ,(Vec3<int> *)CONCAT44(uVar4,in_stack_fffffffffffffed0));
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::center(in_stack_fffffffffffffee8);
  Imath_3_2::Vec3<int>::operator+
            (in_stack_fffffffffffffed8,(Vec3<int> *)CONCAT44(uVar4,in_stack_fffffffffffffed0));
  Imath_3_2::Vec3<int>::operator/(&in_stack_fffffffffffffee8->min,in_stack_fffffffffffffee4);
  bVar2 = Imath_3_2::Vec3<int>::operator==(local_c8,&local_d4);
  if (!bVar2) {
    __assert_fail("b1.center () == (p1 + p0) / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x2c0,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_3_2::Vec3<int>]")
    ;
  }
  Imath_3_2::Vec3<int>::Vec3(local_ec,0);
  Imath_3_2::Vec3<int>::Vec3(&local_f8,local_ec);
  uVar3 = Imath_3_2::Vec3<int>::dimensions();
  piVar6 = Imath_3_2::Vec3<int>::operator[](&local_f8,uVar3 - 1);
  *piVar6 = 2;
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::Box
            ((Box<Imath_3_2::Vec3<int>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
             ,(Vec3<int> *)CONCAT44(uVar4,in_stack_fffffffffffffed0));
  Imath_3_2::Box<Imath_3_2::Vec3<int>_>::center(in_stack_fffffffffffffee8);
  Imath_3_2::Vec3<int>::operator/(&in_stack_fffffffffffffee8->min,in_stack_fffffffffffffee4);
  bVar2 = Imath_3_2::Vec3<int>::operator==
                    ((Vec3<int> *)&stack0xfffffffffffffee4,(Vec3<int> *)&stack0xfffffffffffffed8);
  if (!bVar2) {
    __assert_fail("b.center () == max / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x2d1,
                  "void (anonymous namespace)::testCenter(const char *) [T = Imath_3_2::Vec3<int>]")
    ;
  }
  return;
}

Assistant:

void
testCenter (const char* type)
{
    cout << "    center() for type " << type << endl;

    //
    // Center of empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert (b.center () == T (0));
    }

    //
    // Center of non-empty, has-volume box.
    // Boxes are:
    //    2D: [(-1, -1),         (1, 1)       ]
    //    3D: [(-1, -1, -1),     (1, 1, 1)    ]
    //    4D: [(-1, -1, -1, -1), (1, 1, 1, 1) ]
    //
    // and
    //
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (b0.center () == T (0));

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            int lo = 1 << (i + 1);
            int hi = 1 << (T::dimensions () - i);
            p0[i] = -static_cast<typename T::BaseType>(lo);
            p1[i] = static_cast<typename T::BaseType>(hi);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
        assert (b1.center () == (p1 + p0) / 2);
    }

    //
    // Center of non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (b.center () == max / 2);
    }
}